

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::ScalarReplacementPass::CreateReplacementVariables
          (ScalarReplacementPass *this,Instruction *inst,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  Op OVar1;
  pointer pOVar2;
  spv_position_t *psVar3;
  Instruction **ppIVar4;
  char cVar5;
  uint32_t uVar6;
  Instruction *type;
  uint64_t uVar7;
  size_type sVar8;
  Instruction *pIVar9;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  _Var10;
  spv_position_t *psVar11;
  pointer pOVar12;
  ScalarReplacementPass *pSVar13;
  char **in_R8;
  Instruction *pIVar14;
  ulong uVar15;
  uint32_t elem;
  unique_ptr<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
  components_used;
  undefined1 local_8c [28];
  code *pcStack_70;
  undefined1 local_68 [24];
  _Manager_type p_Stack_50;
  _Invoker_type local_48;
  IRContext *pIStack_40;
  
  type = GetStorageType(this,inst);
  pSVar13 = (ScalarReplacementPass *)local_68;
  GetUsedComponents((ScalarReplacementPass *)local_68,(Instruction *)this);
  local_8c._0_4_ = 0;
  OVar1 = type->opcode_;
  if (OVar1 - OpTypeVector < 2) {
    uVar7 = GetNumElements(pSVar13,type);
    if (uVar7 != 0) {
      uVar15 = 0;
      do {
        uVar6 = (type->has_result_id_ & 1) + 1;
        if (type->has_type_id_ == false) {
          uVar6 = (uint)type->has_result_id_;
        }
        uVar6 = Instruction::GetSingleWordOperand(type,uVar6);
        pSVar13 = this;
        CreateVariable(this,uVar6,inst,(uint32_t)uVar15,replacements);
        uVar15 = (ulong)((uint32_t)uVar15 + 1);
        uVar7 = GetNumElements(pSVar13,type);
      } while (uVar7 != uVar15);
    }
  }
  else if (OVar1 == OpTypeStruct) {
    local_48 = (_Invoker_type)0x0;
    pIStack_40 = (IRContext *)0x0;
    local_68._16_8_ = 0;
    p_Stack_50 = (_Manager_type)0x0;
    local_68._16_8_ = operator_new(0x28);
    *(ScalarReplacementPass **)local_68._16_8_ = this;
    *(Instruction **)(local_68._16_8_ + 8) = inst;
    psVar11 = (spv_position_t *)local_8c;
    *(spv_position_t **)(local_68._16_8_ + 0x10) = psVar11;
    *(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> **)
     (local_68._16_8_ + 0x18) = replacements;
    *(ScalarReplacementPass **)(local_68._16_8_ + 0x20) = (ScalarReplacementPass *)local_68;
    pIStack_40 = (IRContext *)
                 std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp:397:11)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp:397:11)>
               ::_M_manager;
    local_8c._12_8_ = 0;
    pcStack_70 = std::
                 _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:876:22)>
                 ::_M_invoke;
    local_8c._20_8_ =
         std::
         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:876:22)>
         ::_M_manager;
    pOVar12 = (type->operands_).
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pOVar2 = (type->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_8c._4_8_ = (Instruction *)(local_68 + 0x10);
    if (pOVar12 != pOVar2) {
      do {
        if ((pOVar12->type & ~SPV_OPERAND_TYPE_ID) != SPV_OPERAND_TYPE_TYPE_ID) {
          psVar3 = (spv_position_t *)
                   (pOVar12->words).large_data_._M_t.
                   super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl;
          psVar11 = (spv_position_t *)&(pOVar12->words).small_data_;
          if (psVar3 != (spv_position_t *)0x0) {
            psVar11 = psVar3;
          }
          local_68._8_8_ =
               (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&psVar11->line)->
               _M_impl).super__Vector_impl_data._M_start;
          if ((code *)local_8c._20_8_ == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          cVar5 = (*pcStack_70)(local_8c + 4,local_68 + 8);
          if (cVar5 == '\0') break;
        }
        pOVar12 = pOVar12 + 1;
      } while (pOVar12 != pOVar2);
    }
    if ((code *)local_8c._20_8_ != (code *)0x0) {
      (*(code *)local_8c._20_8_)(local_8c + 4,local_8c + 4,3);
    }
    if (local_48 != (_Invoker_type)0x0) {
      (*local_48)((_Any_data *)(local_68 + 0x10),(spv_message_level_t *)(local_68 + 0x10),
                  (char **)0x3,psVar11,in_R8);
    }
  }
  else {
    if (OVar1 != OpTypeArray) {
      __assert_fail("false && \"Unexpected type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                    ,0x1aa,
                    "bool spvtools::opt::ScalarReplacementPass::CreateReplacementVariables(Instruction *, std::vector<Instruction *> *)"
                   );
    }
    uVar7 = GetArrayLength(this,type);
    if (uVar7 != 0) {
      pIVar14 = (Instruction *)0x0;
      do {
        if (((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             local_68._0_8_ ==
             (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)0x0
            ) || (local_8c._4_8_ = pIVar14,
                 sVar8 = std::
                         _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  *)local_68._0_8_,(key_type_conflict2 *)(local_8c + 4)), sVar8 != 0
                 )) {
          uVar6 = (type->has_result_id_ & 1) + 1;
          if (type->has_type_id_ == false) {
            uVar6 = (uint)type->has_result_id_;
          }
          uVar6 = Instruction::GetSingleWordOperand(type,uVar6);
          CreateVariable(this,uVar6,inst,(uint32_t)pIVar14,replacements);
        }
        else {
          uVar6 = (type->has_result_id_ & 1) + 1;
          if (type->has_type_id_ == false) {
            uVar6 = (uint)type->has_result_id_;
          }
          uVar6 = Instruction::GetSingleWordOperand(type,uVar6);
          local_8c._4_8_ = GetUndef(this,uVar6);
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          emplace_back<spvtools::opt::Instruction*>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)replacements,(Instruction **)(local_8c + 4));
        }
        pIVar14 = (Instruction *)(ulong)((uint32_t)pIVar14 + 1);
        pIVar9 = (Instruction *)GetArrayLength(this,type);
      } while (pIVar9 != pIVar14);
    }
  }
  TransferAnnotations(this,inst,replacements);
  local_8c._4_8_ = 0;
  _Var10 = std::
           __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_equals_val<decltype(nullptr)const>>
                     ((replacements->
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (replacements->
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  ppIVar4 = (replacements->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  std::
  unique_ptr<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
  ::~unique_ptr((unique_ptr<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::default_delete<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                 *)local_68);
  return _Var10._M_current == ppIVar4;
}

Assistant:

bool ScalarReplacementPass::CreateReplacementVariables(
    Instruction* inst, std::vector<Instruction*>* replacements) {
  Instruction* type = GetStorageType(inst);

  std::unique_ptr<std::unordered_set<int64_t>> components_used =
      GetUsedComponents(inst);

  uint32_t elem = 0;
  switch (type->opcode()) {
    case spv::Op::OpTypeStruct:
      type->ForEachInOperand(
          [this, inst, &elem, replacements, &components_used](uint32_t* id) {
            if (!components_used || components_used->count(elem)) {
              CreateVariable(*id, inst, elem, replacements);
            } else {
              replacements->push_back(GetUndef(*id));
            }
            elem++;
          });
      break;
    case spv::Op::OpTypeArray:
      for (uint32_t i = 0; i != GetArrayLength(type); ++i) {
        if (!components_used || components_used->count(i)) {
          CreateVariable(type->GetSingleWordInOperand(0u), inst, i,
                         replacements);
        } else {
          uint32_t element_type_id = type->GetSingleWordInOperand(0);
          replacements->push_back(GetUndef(element_type_id));
        }
      }
      break;

    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeVector:
      for (uint32_t i = 0; i != GetNumElements(type); ++i) {
        CreateVariable(type->GetSingleWordInOperand(0u), inst, i, replacements);
      }
      break;

    default:
      assert(false && "Unexpected type.");
      break;
  }

  TransferAnnotations(inst, replacements);
  return std::find(replacements->begin(), replacements->end(), nullptr) ==
         replacements->end();
}